

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

void __thiscall glslang::TVarSetTraverser::~TVarSetTraverser(TVarSetTraverser *this)

{
  (this->super_TLiveTraverser).super_TIntermTraverser._vptr_TIntermTraverser =
       (_func_int **)&PTR__TLiveTraverser_00a5be00;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->super_TLiveTraverser).liveGlobals._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->super_TLiveTraverser).liveFunctions._M_h);
  std::__cxx11::
  _List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::_M_clear
            (&(this->super_TLiveTraverser).destinations.
              super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
            );
  (this->super_TLiveTraverser).super_TIntermTraverser._vptr_TIntermTraverser =
       (_func_int **)&PTR__TIntermTraverser_00a5bc60;
  return;
}

Assistant:

TVarSetTraverser(const TIntermediate& i, const TVarLiveMap& inList, const TVarLiveMap& outList, const TVarLiveMap& uniformList)
      : TLiveTraverser(i, true, true, true, false)
      , inputList(inList)
      , outputList(outList)
      , uniformList(uniformList)
    {
    }